

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImPool<ImGuiTabBar>::~ImPool(ImPool<ImGuiTabBar> *this)

{
  ImPool<ImGuiTabBar> *this_local;
  
  Clear(this);
  ImGuiStorage::~ImGuiStorage(&this->Map);
  ImVector<ImGuiTabBar>::~ImVector(&this->Buf);
  return;
}

Assistant:

~ImPool()   { Clear(); }